

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O0

char * TR_VarDec(ast *node,int *size)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  mapped_type *__k;
  mapped_type *this;
  int *in_RSI;
  ast *in_RDI;
  char *name;
  attr *a;
  ast *c1;
  Array *in_stack_fffffffffffffe18;
  Array *in_stack_fffffffffffffe20;
  Array *in_stack_fffffffffffffe30;
  allocator *paVar4;
  attr *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe58;
  Array *in_stack_fffffffffffffe60;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Array,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Array>_>_>
  *this_00;
  char *in_stack_fffffffffffffe70;
  IrSim *in_stack_fffffffffffffe88;
  string local_170 [39];
  allocator local_149;
  string local_148 [39];
  allocator local_121;
  string local_120 [55];
  allocator local_e9;
  string local_e8 [192];
  char *local_28;
  attr *local_20;
  ast *local_18;
  int *local_10;
  
  local_10 = in_RSI;
  for (local_18 = child(in_RDI,1); local_18->type != 0x11c; local_18 = child(local_18,1)) {
  }
  local_20 = findvar(in_stack_fffffffffffffe70);
  IrSim::newVar(in_stack_fffffffffffffe88);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  pcVar3 = strdup(pcVar3);
  Operand::~Operand((Operand *)0x111275);
  local_28 = pcVar3;
  if (local_20->kind == 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,pcVar3,&local_e9);
    Array::Array(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Array,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Array>_>_>
               *)local_18->lex;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_120,(char *)this_00,&local_121);
    __k = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Array,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Array>_>_>
          ::operator[](this_00,in_stack_fffffffffffffe58);
    Array::operator=(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    Array::~Array(in_stack_fffffffffffffe20);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    if (local_10 != (int *)0x0) {
      pcVar3 = local_18->lex;
      paVar4 = &local_149;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_148,pcVar3,paVar4);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Array,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Array>_>_>
      ::operator[](this_00,(key_type *)__k);
      iVar2 = Array::getSize(in_stack_fffffffffffffe30);
      *local_10 = iVar2;
      std::__cxx11::string::~string(local_148);
      std::allocator<char>::~allocator((allocator<char> *)&local_149);
    }
  }
  else {
    if (local_20->kind != 0) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/src/ir.cpp"
                    ,0x26d,"const char *TR_VarDec(ast *, int *)");
    }
    pcVar1 = local_18->lex;
    paVar4 = (allocator *)&stack0xfffffffffffffe8f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_170,pcVar1,paVar4);
    this = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    std::__cxx11::string::operator=((string *)this,pcVar3);
    std::__cxx11::string::~string(local_170);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe8f);
  }
  return local_28;
}

Assistant:

static const char *TR_VarDec(ast *node, int *size) {
    ast *c1 = child(node, 1);
    while (c1->type != ID) c1 = child(c1, 1);
    attr *a = findvar(c1->lex);
    const char *name = strdup(irSim.newVar().value.c_str());
    if (a->kind == ARRAY) {
        arrays[c1->lex] = Array(name, a);
        if (size) *size = arrays[c1->lex].getSize();
    }
    else if (a->kind == BASIC) basics[c1->lex] = name;
    else assert(false);
    return name;
}